

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertiaNonLinearParametrization.cpp
# Opt level: O0

Vector16 * __thiscall
iDynTree::RigidBodyInertiaNonLinearParametrization::asVectorWithRotationAsVec
          (RigidBodyInertiaNonLinearParametrization *this)

{
  double *pdVar1;
  double *in_RSI;
  VectorFixSize<16U> *in_RDI;
  Stride<0,_0> *this_00;
  PointerArgType dataPtr;
  Map<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_Eigen::Stride<0,_0>_> *this_01;
  double dVar2;
  Vector16 *vectorization;
  EigenBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> *other
  ;
  MatrixFixSize<3U,_3U> *in_stack_ffffffffffffff08;
  VectorFixSize<16U> *mat;
  
  mat = in_RDI;
  VectorFixSize<16U>::VectorFixSize(in_RDI);
  other = (EigenBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
           *)*in_RSI;
  pdVar1 = VectorFixSize<16U>::operator()(in_RDI,0);
  *pdVar1 = (double)other;
  this_00 = (Stride<0,_0> *)VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RSI + 1),0);
  pdVar1 = VectorFixSize<16U>::operator()(in_RDI,1);
  *pdVar1 = (double)this_00;
  dataPtr = (PointerArgType)VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RSI + 1),1);
  pdVar1 = VectorFixSize<16U>::operator()(in_RDI,2);
  *pdVar1 = (double)dataPtr;
  this_01 = (Map<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_Eigen::Stride<0,_0>_> *)
            VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RSI + 1),2);
  pdVar1 = VectorFixSize<16U>::operator()(in_RDI,3);
  *pdVar1 = (double)this_01;
  toEigen<3u,3u>(in_stack_ffffffffffffff08);
  Eigen::Matrix<double,3,3,1,3,3>::
  Matrix<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>
            ((Matrix<double,_3,_3,_1,_3,_3> *)this_00,other);
  vecColMajor((Matrix<double,_3,_3,_1,_3,_3> *)mat);
  VectorFixSize<16U>::data(in_RDI);
  Eigen::Stride<0,_0>::Stride(this_00);
  Eigen::Map<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (this_01,dataPtr,this_00);
  Eigen::Map<Eigen::Matrix<double,9,1,0,9,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_Eigen::Stride<0,_0>_> *)this_00,
             (DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)other);
  dVar2 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RSI + 0xd),0);
  pdVar1 = VectorFixSize<16U>::operator()(in_RDI,0xd);
  *pdVar1 = dVar2;
  dVar2 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RSI + 0xd),1);
  pdVar1 = VectorFixSize<16U>::operator()(in_RDI,0xe);
  *pdVar1 = dVar2;
  dVar2 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RSI + 0xd),2);
  pdVar1 = VectorFixSize<16U>::operator()(in_RDI,0xf);
  *pdVar1 = dVar2;
  return mat;
}

Assistant:

Vector16 RigidBodyInertiaNonLinearParametrization::asVectorWithRotationAsVec() const
{
    using namespace Eigen;

    Vector16 vectorization;

    vectorization(0) = this->mass;

    vectorization(1) = this->com(0);
    vectorization(2) = this->com(1);
    vectorization(3) = this->com(2);

    Map< Matrix<double, 9, 1> >(vectorization.data()+4) = vecColMajor(toEigen(this->link_R_centroidal));

    vectorization(13) = this->centralSecondMomentOfMass(0);
    vectorization(14) = this->centralSecondMomentOfMass(1);
    vectorization(15) = this->centralSecondMomentOfMass(2);



    return vectorization;
}